

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_GIF_Image.cxx
# Opt level: O2

void __thiscall Fl_GIF_Image::Fl_GIF_Image(Fl_GIF_Image *this,char *infname)

{
  uchar uVar1;
  byte bVar2;
  bool bVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  FILE *__stream;
  size_t sVar15;
  uchar *puVar16;
  uchar *puVar17;
  char **ppcVar18;
  ulong uVar19;
  char *pcVar20;
  uchar uVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  int i_1;
  int iVar27;
  uint uVar28;
  uchar *puVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar34;
  uint uVar35;
  int iVar36;
  uint uVar37;
  uint uVar38;
  uchar *puVar39;
  uint uVar40;
  uint uVar41;
  bool bVar42;
  int local_38f4;
  uchar *local_38e8;
  uint local_38d4;
  int local_38cc;
  uint local_38a4;
  uchar Blue [256];
  uchar Green [256];
  uchar Red [256];
  uchar remap [256];
  uchar used [256];
  short Prefix [4096];
  uchar Suffix [4096];
  ulong uVar33;
  
  Fl_Pixmap::Fl_Pixmap(&this->super_Fl_Pixmap,(char **)0x0);
  (this->super_Fl_Pixmap).super_Fl_Image._vptr_Fl_Image = (_func_int **)&PTR__Fl_Pixmap_0027baa8;
  __stream = (FILE *)fl_fopen(infname,"rb");
  if (__stream == (FILE *)0x0) {
    (*Fl::error)("Fl_GIF_Image: Unable to open %s!",infname);
    (this->super_Fl_Pixmap).super_Fl_Image.ld_ = -2;
  }
  else {
    sVar15 = fread(Prefix,1,6,__stream);
    local_38f4 = -2;
    if (sVar15 < 6) {
      fclose(__stream);
    }
    else {
      if ((((char)Prefix[0] == 'G') && (Prefix[0]._1_1_ == 'I')) && ((char)Prefix[1] == 'F')) {
        if ((Prefix[2]._1_1_ != 'a' || Prefix[1]._1_1_ != '8') || '9' < (char)Prefix[2]) {
          (*Fl::warning)("%s is version %c%c%c.",infname,(ulong)(uint)(int)Prefix[1]._1_1_,
                         (ulong)(uint)(int)(char)Prefix[2],(ulong)(uint)(int)Prefix[2]._1_1_);
        }
        getc(__stream);
        getc(__stream);
        getc(__stream);
        getc(__stream);
        local_38e8._0_4_ = getc(__stream);
        uVar40 = 2 << ((byte)(uint)local_38e8 & 7);
        getc(__stream);
        getc(__stream);
        if ((char)(byte)(uint)local_38e8 < '\0') {
          for (uVar31 = 0; uVar40 != uVar31; uVar31 = uVar31 + 1) {
            iVar27 = getc(__stream);
            Red[uVar31] = (uchar)iVar27;
            iVar27 = getc(__stream);
            Green[uVar31] = (uchar)iVar27;
            iVar27 = getc(__stream);
            Blue[uVar31] = (uchar)iVar27;
          }
        }
        else {
          iVar27 = 0;
          (*Fl::warning)("%s does not have a colormap.");
          for (uVar31 = 0; uVar40 != uVar31; uVar31 = uVar31 + 1) {
            uVar1 = (uchar)(iVar27 / (int)(uVar40 - 1));
            Blue[uVar31] = uVar1;
            Green[uVar31] = uVar1;
            Red[uVar31] = uVar1;
            iVar27 = iVar27 + 0xff;
          }
        }
        local_38e8._0_4_ = (uint)local_38e8 & 7;
        bVar3 = false;
        local_38a4 = 0;
        do {
          uVar8 = getc(__stream);
          if ((char)uVar8 == '!') {
            uVar8 = getc(__stream);
            uVar34 = getc(__stream);
            uVar34 = uVar34 & 0xff;
            if (uVar34 == 4 && (uVar8 & 0xff) == 0xf9) {
              uVar8 = getc(__stream);
              getc(__stream);
              getc(__stream);
              local_38a4 = getc(__stream);
              if ((uVar8 & 1) == 0) goto LAB_00204b45;
              bVar3 = true;
              goto LAB_00204b45;
            }
            if ((uVar8 | 0xffffff00) < 0xfffffffe) {
              (*Fl::warning)("%s: unknown gif extension 0x%02x.",infname);
            }
          }
          else {
            if ((uVar8 & 0xff) == 0x2c) goto LAB_00204b86;
            uVar34 = 0;
            (*Fl::warning)("%s: unknown gif code 0x%02x",infname,(ulong)(uVar8 & 0xff));
          }
          for (; uVar34 != 0; uVar34 = uVar34 & 0xff) {
            while (bVar42 = uVar34 != 0, uVar34 = uVar34 - 1, bVar42) {
              getc(__stream);
            }
LAB_00204b45:
            uVar34 = getc(__stream);
          }
        } while( true );
      }
      fclose(__stream);
      (*Fl::error)("Fl_GIF_Image: %s is not a GIF file.\n",infname);
      local_38f4 = -3;
    }
    (this->super_Fl_Pixmap).super_Fl_Image.ld_ = local_38f4;
  }
  return;
LAB_00204b86:
  getc(__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  uVar8 = getc(__stream);
  uVar34 = getc(__stream);
  iVar27 = (uVar34 & 0xff) * 0x100;
  uVar35 = iVar27 + (uVar8 & 0xff);
  uVar31 = (ulong)uVar35;
  uVar34 = getc(__stream);
  uVar9 = getc(__stream);
  uVar9 = (uVar9 & 0xff) * 0x100;
  uVar10 = uVar9 + (uVar34 & 0xff);
  uVar11 = getc(__stream);
  if ((char)(byte)uVar11 < '\0') {
    for (uVar30 = 0; (uint)(2 << ((byte)uVar11 & 7)) != uVar30; uVar30 = uVar30 + 1) {
      iVar36 = getc(__stream);
      Red[uVar30] = (uchar)iVar36;
      iVar36 = getc(__stream);
      Green[uVar30] = (uchar)iVar36;
      iVar36 = getc(__stream);
      Blue[uVar30] = (uchar)iVar36;
    }
  }
  uVar12 = getc(__stream);
  uVar37 = 1 << ((byte)uVar12 & 0x1f);
  uVar30 = (ulong)uVar40;
  if ((uVar12 & 0xff) <= (uint)local_38e8) {
    uVar30 = (ulong)uVar37;
  }
  uVar24 = (ulong)(uVar10 * uVar35);
  puVar16 = (uchar *)operator_new__(uVar24);
  iVar36 = (uVar12 & 0xff) + 1;
  local_38e8 = puVar16 + uVar31;
  uVar28 = ~(-2 << ((byte)uVar12 & 0x1f));
  uVar40 = getc(__stream);
  uVar13 = getc(__stream);
  uVar41 = (uVar40 & 0xff) - 1;
  local_38cc = 0;
  bVar7 = 0;
  local_38d4 = 0;
  iVar25 = 0;
  puVar29 = puVar16;
  uVar40 = uVar28;
  uVar12 = uVar37;
  iVar23 = iVar36;
  uVar38 = uVar37 + 2;
LAB_00204cef:
  uVar19 = (ulong)uVar12;
  uVar22 = uVar40;
  iVar26 = iVar23;
  do {
    uVar14 = uVar38;
    iVar23 = iVar26;
    uVar40 = uVar22;
    uVar33 = uVar19;
    uVar32 = (uint)uVar33;
    uVar12 = uVar13 & 0xff;
    uVar38 = iVar25 + iVar23;
    if (7 < (int)uVar38) {
      if ((int)uVar41 < 1) {
        uVar41 = getc(__stream);
        uVar41 = uVar41 & 0xff;
        if (uVar41 == 0) goto LAB_00204fe5;
      }
      uVar13 = getc(__stream);
      uVar41 = uVar41 - 1;
      uVar12 = uVar12 | (uVar13 & 0xff) << 8;
      if (0xf < uVar38) {
        if (uVar41 == 0) {
          uVar41 = getc(__stream);
          uVar41 = uVar41 & 0xff;
          if (uVar41 == 0) goto LAB_00204fe5;
        }
        uVar13 = getc(__stream);
        uVar41 = uVar41 - 1;
        uVar12 = uVar12 | (uVar13 & 0xff) << 0x10;
      }
    }
    uVar12 = uVar12 >> ((byte)iVar25 & 0x1f) & uVar40;
    iVar25 = (int)uVar38 % 8;
    uVar19 = (ulong)uVar37;
    uVar22 = uVar28;
    iVar26 = iVar36;
    uVar38 = uVar37 + 2;
  } while (uVar12 == uVar37);
  if (uVar12 == uVar37 + 1) goto LAB_00204fe5;
  uVar22 = uVar12;
  puVar39 = used;
  if ((int)uVar14 <= (int)uVar12) {
    if (uVar12 != uVar14) {
      (*Fl::error)("Fl_GIF_Image: %s - LZW Barf!",infname);
LAB_00204fe5:
      (this->super_Fl_Pixmap).super_Fl_Image.w_ = uVar35;
      (this->super_Fl_Pixmap).super_Fl_Image.h_ = uVar10;
      (this->super_Fl_Pixmap).super_Fl_Image.d_ = 1;
      ppcVar18 = (char **)operator_new__((ulong)(uVar10 * 8 + 0x10));
      uVar6 = Red[0];
      uVar5 = Green[0];
      uVar4 = Blue[0];
      uVar1 = (uchar)local_38a4;
      if ((bVar3) && (uVar1 != '\0')) {
        puVar29 = puVar16 + uVar24;
LAB_0020503e:
        if (puVar16 < puVar29) {
          puVar29 = puVar29 + -1;
          if (*puVar29 != uVar1) goto LAB_00205051;
          uVar21 = '\0';
          goto LAB_00205058;
        }
        local_38a4 = local_38a4 & 0xff;
        Red[0] = Red[local_38a4];
        Red[local_38a4] = uVar6;
        Green[0] = Green[local_38a4];
        Green[local_38a4] = uVar5;
        Blue[0] = Blue[local_38a4];
        Blue[local_38a4] = uVar4;
      }
      for (uVar19 = 0; uVar30 != uVar19; uVar19 = uVar19 + 1) {
        used[uVar19] = '\0';
      }
      puVar39 = puVar16 + uVar24;
      for (puVar29 = puVar39; puVar16 < puVar29; puVar29 = puVar29 + -1) {
        used[puVar29[-1]] = '\x01';
      }
      bVar7 = (used[0] != '\0' && bVar3) ^ 0x21;
      iVar36 = 0;
      for (uVar24 = 0; uVar30 != uVar24; uVar24 = uVar24 + 1) {
        if (used[uVar24] != '\0') {
          remap[uVar24] = bVar7;
          bVar7 = bVar7 + 1;
          iVar36 = iVar36 + 1;
        }
      }
      iVar23 = sprintf((char *)Suffix,"%d %d %d %d",uVar31,(ulong)uVar10,(ulong)(uint)-iVar36,1);
      pcVar20 = (char *)operator_new__((long)(iVar23 + 1));
      *ppcVar18 = pcVar20;
      strcpy(pcVar20,(char *)Suffix);
      puVar29 = (uchar *)operator_new__((long)(iVar36 << 2));
      ppcVar18[1] = (char *)puVar29;
      for (uVar24 = 0; uVar30 != uVar24; uVar24 = uVar24 + 1) {
        if (used[uVar24] != '\0') {
          *puVar29 = remap[uVar24];
          puVar29[1] = Red[uVar24];
          puVar29[2] = Green[uVar24];
          puVar29[3] = Blue[uVar24];
          puVar29 = puVar29 + 4;
        }
      }
      for (; puVar16 < puVar39; puVar39 = puVar39 + -1) {
        puVar39[-1] = remap[puVar39[-1]];
      }
      puVar29 = puVar16;
      for (uVar30 = 0; (uVar9 | uVar34 & 0xff) != uVar30; uVar30 = uVar30 + 1) {
        pcVar20 = (char *)operator_new__((ulong)(uVar35 + 1));
        ppcVar18[uVar30 + 2] = pcVar20;
        memcpy(pcVar20,puVar29,uVar31);
        pcVar20[uVar31] = '\0';
        puVar29 = puVar29 + (iVar27 + (uVar8 & 0xff));
      }
      (this->super_Fl_Pixmap).super_Fl_Image.data_ = ppcVar18;
      (this->super_Fl_Pixmap).super_Fl_Image.count_ = uVar10 + 2;
      (this->super_Fl_Pixmap).alloc_data = 1;
      operator_delete__(puVar16);
      fclose(__stream);
      return;
    }
    used[0] = (uchar)local_38d4;
    puVar39 = used + 1;
    uVar22 = uVar32;
  }
  for (; puVar17 = puVar39 + 1, (int)uVar30 <= (int)uVar22; uVar22 = (int)Prefix[uVar22]) {
    *puVar39 = Suffix[uVar22];
    puVar39 = puVar17;
  }
  *puVar39 = (uchar)uVar22;
  do {
    *puVar29 = puVar17[-1];
    puVar29 = puVar29 + 1;
    if (local_38e8 <= puVar29) {
      if ((uVar11 & 0x40) == 0) {
        local_38cc = local_38cc + 1;
      }
      else {
        switch(bVar7) {
        case 0:
          local_38cc = local_38cc + 8;
          bVar7 = (int)uVar10 <= local_38cc;
          if ((int)uVar10 <= local_38cc) {
            local_38cc = 4;
          }
          break;
        case 1:
          iVar26 = local_38cc + 8;
          local_38cc = iVar26;
          if ((int)uVar10 <= iVar26) {
            local_38cc = 2;
          }
          bVar7 = ((int)uVar10 <= iVar26) + 1;
          break;
        case 2:
          iVar26 = local_38cc + 4;
          local_38cc = iVar26;
          if ((int)uVar10 <= iVar26) {
            local_38cc = 1;
          }
          bVar7 = iVar26 < (int)uVar10 ^ 3;
          break;
        case 3:
          bVar7 = 3;
          local_38cc = local_38cc + 2;
        }
      }
      if ((int)uVar10 <= local_38cc) {
        local_38cc = 0;
      }
      puVar29 = puVar16 + (int)(local_38cc * uVar35);
      local_38e8 = puVar29 + uVar31;
    }
    puVar17 = puVar17 + -1;
  } while (used < puVar17);
  local_38d4 = uVar22;
  uVar38 = uVar14;
  if (uVar32 != uVar37) {
    Prefix[(int)uVar14] = (short)uVar33;
    Suffix[(int)uVar14] = (uchar)uVar22;
    uVar38 = uVar14 + 1;
    if (((int)uVar40 <= (int)uVar14) && (uVar38 = uVar14, iVar23 < 0xc)) {
      bVar2 = (byte)iVar23;
      iVar23 = iVar23 + 1;
      uVar40 = (2 << (bVar2 & 0x1f)) - 1;
      uVar38 = uVar14 + 1;
    }
  }
  goto LAB_00204cef;
LAB_00205051:
  uVar21 = uVar1;
  if (*puVar29 == '\0') {
LAB_00205058:
    *puVar29 = uVar21;
  }
  goto LAB_0020503e;
}

Assistant:

Fl_GIF_Image::Fl_GIF_Image(const char *infname) : Fl_Pixmap((char *const*)0) {
  FILE *GifFile;	// File to read
  char **new_data;	// Data array

  if ((GifFile = fl_fopen(infname, "rb")) == NULL) {
    Fl::error("Fl_GIF_Image: Unable to open %s!", infname);
    ld(ERR_FILE_ACCESS);
    return;
  }

  {char b[6];
  if (fread(b,1,6,GifFile)<6) {
    fclose(GifFile);
    ld(ERR_FILE_ACCESS);
    return; /* quit on eof */
  }
  if (b[0]!='G' || b[1]!='I' || b[2] != 'F') {
    fclose(GifFile);
    Fl::error("Fl_GIF_Image: %s is not a GIF file.\n", infname);
    ld(ERR_FORMAT);
    return;
  }
  if (b[3]!='8' || b[4]>'9' || b[5]!= 'a')
    Fl::warning("%s is version %c%c%c.",infname,b[3],b[4],b[5]);
  }

  int Width; GETSHORT(Width);
  int Height; GETSHORT(Height);

  uchar ch = NEXTBYTE;
  char HasColormap = ((ch & 0x80) != 0);
  int BitsPerPixel = (ch & 7) + 1;
  int ColorMapSize = 1 << BitsPerPixel;
  // int OriginalResolution = ((ch>>4)&7)+1;
  // int SortedTable = (ch&8)!=0;
  ch = NEXTBYTE; // Background Color index
  ch = NEXTBYTE; // Aspect ratio is N/64

  // Read in global colormap:
  uchar transparent_pixel = 0;
  char has_transparent = 0;
  uchar Red[256], Green[256], Blue[256]; /* color map */
  if (HasColormap) {
    for (int i=0; i < ColorMapSize; i++) {	
      Red[i] = NEXTBYTE;
      Green[i] = NEXTBYTE;
      Blue[i] = NEXTBYTE;
    }
  } else {
    Fl::warning("%s does not have a colormap.", infname);
    for (int i = 0; i < ColorMapSize; i++)
      Red[i] = Green[i] = Blue[i] = (uchar)(255 * i / (ColorMapSize-1));
  }

  int CodeSize;		/* Code size, init from GIF header, increases... */
  char Interlace;

  for (;;) {

    int i = NEXTBYTE;
    if (i<0) {
      fclose(GifFile);
      Fl::error("Fl_GIF_Image: %s - unexpected EOF",infname); 
      w(0); h(0); d(0); ld(ERR_FORMAT);
      return;
    }
    int blocklen;

    //  if (i == 0x3B) return 0;  eof code

    if (i == 0x21) {		// a "gif extension"

      ch = NEXTBYTE;
      blocklen = NEXTBYTE;

      if (ch==0xF9 && blocklen==4) { // Netscape animation extension

	char bits;
	bits = NEXTBYTE;
	getc(GifFile); getc(GifFile); // GETSHORT(delay);
	transparent_pixel = NEXTBYTE;
	if (bits & 1) has_transparent = 1;
	blocklen = NEXTBYTE;

      } else if (ch == 0xFF) { // Netscape repeat count
	;

      } else if (ch != 0xFE) { //Gif Comment
	Fl::warning("%s: unknown gif extension 0x%02x.", infname, ch);
      }
    } else if (i == 0x2c) {	// an image

      ch = NEXTBYTE; ch = NEXTBYTE; // GETSHORT(x_position);
      ch = NEXTBYTE; ch = NEXTBYTE; // GETSHORT(y_position);
      GETSHORT(Width);
      GETSHORT(Height);
      ch = NEXTBYTE;
      Interlace = ((ch & 0x40) != 0);
      if (ch&0x80) { 
	// read local color map
	int n = 2<<(ch&7);
	for (i=0; i < n; i++) {	
	  Red[i] = NEXTBYTE;
	  Green[i] = NEXTBYTE;
	  Blue[i] = NEXTBYTE;
	}
      }
      CodeSize = NEXTBYTE+1;
      break; // okay, this is the image we want
    } else {
      Fl::warning("%s: unknown gif code 0x%02x", infname, i);
      blocklen = 0;
    }

    // skip the data:
    while (blocklen>0) {while (blocklen--) {ch = NEXTBYTE;} blocklen=NEXTBYTE;}
  }

  if (BitsPerPixel >= CodeSize)
  {
    // Workaround for broken GIF files...
    BitsPerPixel = CodeSize - 1;
    ColorMapSize = 1 << BitsPerPixel;
  }

  uchar *Image = new uchar[Width*Height];

  int YC = 0, Pass = 0; /* Used to de-interlace the picture */
  uchar *p = Image;
  uchar *eol = p+Width;

  int InitCodeSize = CodeSize;
  int ClearCode = (1 << (CodeSize-1));
  int EOFCode = ClearCode + 1;
  int FirstFree = ClearCode + 2;
  int FinChar = 0;
  int ReadMask = (1<<CodeSize) - 1;
  int FreeCode = FirstFree;
  int OldCode = ClearCode;

  // tables used by LZW decompresser:
  short int Prefix[4096];
  uchar Suffix[4096];

  int blocklen = NEXTBYTE;
  uchar thisbyte = NEXTBYTE; blocklen--;
  int frombit = 0;

  for (;;) {

/* Fetch the next code from the raster data stream.  The codes can be
 * any length from 3 to 12 bits, packed into 8-bit bytes, so we have to
 * maintain our location as a pointer and a bit offset.
 * In addition, gif adds totally useless and annoying block counts
 * that must be correctly skipped over. */
    int CurCode = thisbyte;
    if (frombit+CodeSize > 7) {
      if (blocklen <= 0) {
	blocklen = NEXTBYTE;
	if (blocklen <= 0) break;
      }
      thisbyte = NEXTBYTE; blocklen--;
      CurCode |= thisbyte<<8;
    }
    if (frombit+CodeSize > 15) {
      if (blocklen <= 0) {
	blocklen = NEXTBYTE;
	if (blocklen <= 0) break;
      }
      thisbyte = NEXTBYTE; blocklen--;
      CurCode |= thisbyte<<16;
    }
    CurCode = (CurCode>>frombit)&ReadMask;
    frombit = (frombit+CodeSize)%8;

    if (CurCode == ClearCode) {
      CodeSize = InitCodeSize;
      ReadMask = (1<<CodeSize) - 1;
      FreeCode = FirstFree;
      OldCode = ClearCode;
      continue;
    }

    if (CurCode == EOFCode) break;

    uchar OutCode[1025]; // temporary array for reversing codes
    uchar *tp = OutCode;
    int i;
    if (CurCode < FreeCode) i = CurCode;
    else if (CurCode == FreeCode) {*tp++ = (uchar)FinChar; i = OldCode;}
    else {Fl::error("Fl_GIF_Image: %s - LZW Barf!", infname); break;}

    while (i >= ColorMapSize) {*tp++ = Suffix[i]; i = Prefix[i];}
    *tp++ = FinChar = i;
    do {
      *p++ = *--tp;
      if (p >= eol) {
	if (!Interlace) YC++;
	else switch (Pass) {
	case 0: YC += 8; if (YC >= Height) {Pass++; YC = 4;} break;
	case 1: YC += 8; if (YC >= Height) {Pass++; YC = 2;} break;
	case 2: YC += 4; if (YC >= Height) {Pass++; YC = 1;} break;
	case 3: YC += 2; break;
	}
	if (YC>=Height) YC=0; /* cheap bug fix when excess data */
	p = Image + YC*Width;
	eol = p+Width;
      }
    } while (tp > OutCode);

    if (OldCode != ClearCode) {
      Prefix[FreeCode] = (short)OldCode;
      Suffix[FreeCode] = FinChar;
      FreeCode++;
      if (FreeCode > ReadMask) {
	if (CodeSize < 12) {
	  CodeSize++;
	  ReadMask = (1 << CodeSize) - 1;
	}
	else FreeCode--;
      }
    }
    OldCode = CurCode;
  }

  // We are done reading the file, now convert to xpm:

  // allocate line pointer arrays:
  w(Width);
  h(Height);
  d(1);
  new_data = new char*[Height+2];

  // transparent pixel must be zero, swap if it isn't:
  if (has_transparent && transparent_pixel != 0) {
    // swap transparent pixel with zero
    p = Image+Width*Height;
    while (p-- > Image) {
      if (*p==transparent_pixel) *p = 0;
      else if (!*p) *p = transparent_pixel;
    }
    uchar t;
    t                        = Red[0];
    Red[0]                   = Red[transparent_pixel];
    Red[transparent_pixel]   = t;

    t                        = Green[0];
    Green[0]                 = Green[transparent_pixel];
    Green[transparent_pixel] = t;

    t                        = Blue[0];
    Blue[0]                  = Blue[transparent_pixel];
    Blue[transparent_pixel]  = t;
  }

  // find out what colors are actually used:
  uchar used[256]; uchar remap[256];
  int i;
  for (i = 0; i < ColorMapSize; i++) used[i] = 0;
  p = Image+Width*Height;
  while (p-- > Image) used[*p] = 1;

  // remap them to start with printing characters:
  int base = has_transparent && used[0] ? ' ' : ' '+1;
  int numcolors = 0;
  for (i = 0; i < ColorMapSize; i++) if (used[i]) {
    remap[i] = (uchar)(base++);
    numcolors++;
  }

  // write the first line of xpm data (use suffix as temp array):
  int length = sprintf((char*)(Suffix),
		       "%d %d %d %d",Width,Height,-numcolors,1);
  new_data[0] = new char[length+1];
  strcpy(new_data[0], (char*)Suffix);

  // write the colormap
  new_data[1] = (char*)(p = new uchar[4*numcolors]);
  for (i = 0; i < ColorMapSize; i++) if (used[i]) {
    *p++ = remap[i];
    *p++ = Red[i];
    *p++ = Green[i];
    *p++ = Blue[i];
  }

  // remap the image data:
  p = Image+Width*Height;
  while (p-- > Image) *p = remap[*p];

  // split the image data into lines:
  for (i=0; i<Height; i++) {
    new_data[i+2] = new char[Width+1];
    memcpy(new_data[i + 2], (char*)(Image + i*Width), Width);
    new_data[i + 2][Width] = 0;
  }

  data((const char **)new_data, Height + 2);
  alloc_data = 1;

  delete[] Image;

  fclose(GifFile);
}